

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

void __thiscall CVmFormatter::buffer_string(CVmFormatter *this,char *txt)

{
  wchar_t wVar1;
  size_t sVar2;
  char *in_RSI;
  char *local_10;
  
  local_10 = in_RSI;
  while( true ) {
    wVar1 = utf8_ptr::s_getch(local_10);
    if (wVar1 == L'\0') break;
    utf8_ptr::s_getch(local_10);
    buffer_char(this,txt._4_4_);
    sVar2 = utf8_ptr::s_charsize(*local_10);
    local_10 = local_10 + sVar2;
  }
  return;
}

Assistant:

void CVmFormatter::buffer_string(VMG_ const char *txt)
{
    /* write out each character in the string */
    for ( ; utf8_ptr::s_getch(txt) != 0 ; txt += utf8_ptr::s_charsize(*txt))
        buffer_char(vmg_ utf8_ptr::s_getch(txt));
}